

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,SStream *O,m680x_info *info,cs_m680x_op *op)

{
  uint32_t uVar1;
  cs_struct *in_RCX;
  SStream *OS;
  uint uVar2;
  long in_RDX;
  SStream *in_RSI;
  long in_RDI;
  cs_m680x_op *in_stack_ffffffffffffffc8;
  m680x_info *in_stack_ffffffffffffffd0;
  
  OS = (SStream *)(ulong)(in_RCX->arch - CS_ARCH_ARM64);
  switch(OS) {
  case (SStream *)0x0:
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    break;
  case (SStream *)0x1:
    if (*(int *)(*(long *)(in_RDI + 800) + 100) == 0) {
      SStream_concat(in_RSI,"#%d",(ulong)(uint)in_RCX->mode);
    }
    else {
      uVar1 = get_unsigned(in_RCX->mode,(uint)*(byte *)((long)&in_RCX->printer_info + 4));
      SStream_concat(in_RSI,"#%u",(ulong)uVar1);
    }
    break;
  case (SStream *)0x2:
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"[");
    }
    if (*(int *)&in_RCX->printer == 0) {
      if (*(char *)&in_RCX->printer_info == '\0') {
        if ((*(char *)((long)&in_RCX->printer_info + 1) != '\0') && (*(int *)(in_RDX + 0x10) == 9))
        {
          uVar2 = (uint)*(char *)((long)&in_RCX->printer_info + 1);
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          SStream_concat(in_RSI,"%d",(ulong)uVar2);
        }
      }
      else if (in_RCX->mode == 0x13) {
        SStream_concat(in_RSI,"$%04X",(ulong)*(ushort *)((long)&in_RCX->printer + 6));
      }
      else {
        SStream_concat(in_RSI,"%d",(ulong)(uint)(int)*(short *)((long)&in_RCX->printer + 4));
      }
    }
    else {
      printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    if (((ulong)in_RCX->printer_info & 0x20000) == 0) {
      SStream_concat(in_RSI,",");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if ((in_RCX->mode == 0x13) && (*(char *)&in_RCX->printer_info != '\0')) {
      SStream_concat(in_RSI,"R");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"]");
    }
    break;
  case (SStream *)0x3:
    if ((in_RCX->mode & 0x10000) == CS_MODE_ARM) {
      if ((ushort)(short)in_RCX->mode < CS_MODE_M680X_6811) {
        SStream_concat(in_RSI,">$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
      else {
        SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
    }
    else {
      SStream_concat(in_RSI,"[$%04X]",(ulong)(ushort)(short)in_RCX->mode);
    }
    break;
  case (SStream *)0x4:
    SStream_concat(in_RSI,"$%02X",(ulong)(byte)(char)in_RCX->mode);
    break;
  case (SStream *)0x5:
    SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
    break;
  case (SStream *)0x6:
    SStream_concat(in_RSI,"%u",(ulong)(byte)(char)in_RCX->mode);
    break;
  default:
    SStream_concat(in_RSI,"<invalid_operand>");
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned Reg = MCOperand_getReg(Op);
		SStream_concat0(O, getRegisterName(Reg, AArch64_NoRegAltName));
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				if (MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.base == ARM64_REG_INVALID) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.base = Reg;
				}
				else if (MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.index == ARM64_REG_INVALID) {
					MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.index = Reg;
				}
			} else {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_REG;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].reg = Reg;
				MI->flat_insn->detail->arm64.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);

		if (MI->Opcode == AArch64_ADR) {
			imm += MI->address;
			printUInt64Bang(O, imm);
		} else {
			if (MI->csh->doing_mem) {
				if (MI->csh->imm_unsigned) {
					printUInt64Bang(O, imm);
				} else {
					printInt64Bang(O, imm);
				}
			} else
				printUInt64Bang(O, imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.disp = (int32_t)imm;
			} else {
#ifndef CAPSTONE_DIET
				uint8_t access;
				access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
				MI->ac_idx++;
#endif
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
				MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = imm;
				MI->flat_insn->detail->arm64.op_count++;
			}
		}
	}
}